

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O2

void __thiscall
vkt::sparse::anon_unknown_0::DrawGridTestInstance::DrawGridTestInstance
          (DrawGridTestInstance *this,Context *context,TestFlags flags,VkBufferUsageFlags usage,
          VkDeviceSize minChunkSize)

{
  DeviceDriver *vk;
  SparseAllocation *pSVar1;
  VkDevice device;
  VkDeviceSize bufferSize;
  PtrData<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  VkBufferCreateInfo referenceCreateInfo;
  ulong uVar2;
  deUint32 chunkOffset;
  deUint32 numChunks;
  bool bVar3;
  SparseAllocation *pSVar4;
  void *pvVar5;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_108;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_e0;
  SparseAllocationBuilder builder;
  VkBufferCreateInfo referenceBufferCreateInfo;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_58;
  
  SparseBufferTestInstance::SparseBufferTestInstance
            (&this->super_SparseBufferTestInstance,context,flags);
  numChunks = (deUint32)context;
  (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__DrawGridTestInstance_00bd9f68;
  (this->super_SparseBufferTestInstance).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR__DrawGridTestInstance_00bd9f98;
  (this->m_sparseAllocation).
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  .m_data.ptr = (SparseAllocation *)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_stagingBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0
  ;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vk = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  referenceBufferCreateInfo.flags =
       (uint)(this->super_SparseBufferTestInstance).m_residency * 2 +
       (uint)(this->super_SparseBufferTestInstance).m_aliased * 4 + 1;
  referenceBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  referenceBufferCreateInfo.pNext = (void *)0x0;
  referenceBufferCreateInfo.size = 0;
  referenceBufferCreateInfo.usage = usage | 2;
  referenceBufferCreateInfo.queueFamilyIndexCount = 0;
  referenceBufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bVar3 = (this->super_SparseBufferTestInstance).m_sparseQueue.queueFamilyIndex !=
          (this->super_SparseBufferTestInstance).m_universalQueue.queueFamilyIndex;
  if (bVar3) {
    referenceBufferCreateInfo.queueFamilyIndexCount = 2;
    referenceBufferCreateInfo.pQueueFamilyIndices =
         (this->super_SparseBufferTestInstance).m_sharedQueueFamilyIndices;
  }
  referenceBufferCreateInfo.sharingMode = (VkSharingMode)bVar3;
  local_e0 = &this->m_stagingBufferAlloc;
  SparseAllocationBuilder::SparseAllocationBuilder(&builder);
  SparseAllocationBuilder::addMemoryBind(&builder,numChunks);
  if ((this->super_SparseBufferTestInstance).m_residency == true) {
    builder.m_resourceChunkNdx = builder.m_resourceChunkNdx + 1;
  }
  SparseAllocationBuilder::addMemoryAllocation(&builder);
  builder.m_memoryChunkNdx = builder.m_memoryChunkNdx + 1;
  builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start[builder._0_8_ & 0xffffffff] =
       builder.m_chunksPerAllocation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
       ._M_impl.super__Vector_impl_data._M_start[builder._0_8_ & 0xffffffff] + 1;
  SparseAllocationBuilder::addMemoryBind(&builder,numChunks);
  if ((this->super_SparseBufferTestInstance).m_aliased == true) {
    SparseAllocationBuilder::addAliasedMemoryBind
              (&builder,numChunks,chunkOffset,
               (deUint32)
               builder.m_chunksPerAllocation.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  pSVar4 = (SparseAllocation *)
           CONCAT44(referenceBufferCreateInfo._4_4_,referenceBufferCreateInfo.sType);
  referenceCreateInfo._20_4_ = referenceBufferCreateInfo._20_4_;
  referenceCreateInfo.flags = referenceBufferCreateInfo.flags;
  referenceCreateInfo.sharingMode = referenceBufferCreateInfo.sharingMode;
  referenceCreateInfo.usage = referenceBufferCreateInfo.usage;
  referenceCreateInfo._44_4_ = referenceBufferCreateInfo._44_4_;
  referenceCreateInfo.queueFamilyIndexCount = referenceBufferCreateInfo.queueFamilyIndexCount;
  referenceCreateInfo.pNext = referenceBufferCreateInfo.pNext;
  referenceCreateInfo._0_8_ = pSVar4;
  referenceCreateInfo.size = referenceBufferCreateInfo.size;
  referenceCreateInfo.pQueueFamilyIndices = referenceBufferCreateInfo.pQueueFamilyIndices;
  pvVar5 = referenceBufferCreateInfo.pNext;
  SparseAllocationBuilder::build
            ((MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
              *)&local_108,&builder,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             referenceCreateInfo,minChunkSize);
  local_108.m_data.object.m_internal = 0;
  data._8_8_ = pvVar5;
  data.ptr = pSVar4;
  de::details::
  MovePtr<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::operator=(&this->m_sparseAllocation,data);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
  ::reset((UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           *)&local_108);
  SparseAllocationBuilder::~SparseAllocationBuilder(&builder);
  referenceBufferCreateInfo.size =
       ((this->m_sparseAllocation).
        super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
        .m_data.ptr)->resourceSize;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_108,&vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             &referenceBufferCreateInfo);
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108.m_data.deleter.m_device;
  builder.m_memoryBinds.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_108.m_data.deleter.m_allocator;
  builder.m_allocationNdx = (undefined4)local_108.m_data.object.m_internal;
  builder.m_resourceChunkNdx = local_108.m_data.object.m_internal._4_4_;
  builder._8_8_ = local_108.m_data.deleter.m_deviceIface;
  local_108.m_data.object.m_internal = 0;
  local_108.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_108.m_data.deleter.m_device = (VkDevice)0x0;
  local_108.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       builder.m_memoryBinds.
       super__Vector_base<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       builder._0_8_;
  (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)builder._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_108);
  bindSparseBuffer(&vk->super_DeviceInterface,
                   (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
                   m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (this->super_SparseBufferTestInstance).m_sparseQueue.queueHandle,
                   (VkBuffer)
                   (this->m_sparseBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                   object.m_internal,
                   (this->m_sparseAllocation).
                   super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
                   .m_data.ptr);
  pSVar1 = (this->m_sparseAllocation).
           super_UniqueBase<vkt::sparse::(anonymous_namespace)::SparseAllocation,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::SparseAllocation>_>
           .m_data.ptr;
  uVar2 = pSVar1->resourceSize / (ulong)pSVar1->numResourceChunks;
  this->m_perDrawBufferOffset = uVar2;
  bufferSize = uVar2 * 2;
  this->m_stagingBufferSize = bufferSize;
  device = (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_logicalDevice.
           super_RefBase<vk::VkDevice_s_*>.m_data.object;
  makeBufferCreateInfo((VkBufferCreateInfo *)&builder,bufferSize,1);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_58,&vk->super_DeviceInterface,device,
             (VkBufferCreateInfo *)&builder);
  local_108.m_data.deleter.m_device = local_58.m_data.deleter.m_device;
  local_108.m_data.deleter.m_allocator = local_58.m_data.deleter.m_allocator;
  local_108.m_data.object.m_internal = local_58.m_data.object.m_internal;
  local_108.m_data.deleter.m_deviceIface = local_58.m_data.deleter.m_deviceIface;
  local_58.m_data.object.m_internal = 0;
  local_58.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_58.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&(this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       local_108.m_data.deleter.m_device;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       local_108.m_data.deleter.m_allocator;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       local_108.m_data.object.m_internal;
  (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = local_108.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_58);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder,
             &vk->super_DeviceInterface,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.
             m_logicalDevice.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (this->super_SparseBufferTestInstance).super_SparseResourcesBaseInstance.m_allocator.
             super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
             (VkBuffer)
             (this->m_stagingBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,(MemoryRequirement)0x1);
  builder.m_allocationNdx = 0;
  builder.m_resourceChunkNdx = 0;
  data_00._8_8_ = pvVar5;
  data_00.ptr = (Allocation *)pSVar4;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&local_e0->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&builder);
  return;
}

Assistant:

DrawGridTestInstance (Context& context, const TestFlags flags, const VkBufferUsageFlags usage, const VkDeviceSize minChunkSize)
		: SparseBufferTestInstance	(context, flags)
	{
		const DeviceInterface&	vk							= getDeviceInterface();
		VkBufferCreateInfo		referenceBufferCreateInfo	= getSparseBufferCreateInfo(usage);

		{
			// Allocate two chunks, each covering half of the viewport
			SparseAllocationBuilder builder;
			builder.addMemoryBind();

			if (m_residency)
				builder.addResourceHole();

			builder
				.addMemoryAllocation()
				.addMemoryHole()
				.addMemoryBind();

			if (m_aliased)
				builder.addAliasedMemoryBind(0u, 0u);

			m_sparseAllocation	= builder.build(vk, getDevice(), getAllocator(), referenceBufferCreateInfo, minChunkSize);
		}

		// Create the buffer
		referenceBufferCreateInfo.size	= m_sparseAllocation->resourceSize;
		m_sparseBuffer					= makeBuffer(vk, getDevice(), referenceBufferCreateInfo);

		// Bind the memory
		bindSparseBuffer(vk, getDevice(), m_sparseQueue.queueHandle, *m_sparseBuffer, *m_sparseAllocation);

		m_perDrawBufferOffset	= m_sparseAllocation->resourceSize / m_sparseAllocation->numResourceChunks;
		m_stagingBufferSize		= 2 * m_perDrawBufferOffset;
		m_stagingBuffer			= makeBuffer(vk, getDevice(), makeBufferCreateInfo(m_stagingBufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT));
		m_stagingBufferAlloc	= bindBuffer(vk, getDevice(), getAllocator(), *m_stagingBuffer, MemoryRequirement::HostVisible);
	}